

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O1

int __thiscall
Catch::Generators::anon_unknown_3::GeneratorTracker::close(GeneratorTracker *this,int __fd)

{
  long lVar1;
  pointer pcVar2;
  pointer puVar3;
  ITracker *pIVar4;
  uint uVar5;
  int iVar6;
  __normal_iterator<const_Catch::StringRef_*,_std::vector<Catch::StringRef,_std::allocator<Catch::StringRef>_>_>
  _Var7;
  GeneratorUntypedBase *pGVar8;
  GeneratorUntypedBase *pGVar9;
  long lVar10;
  pointer puVar11;
  pointer puVar12;
  GeneratorTracker *pGVar13;
  bool bVar14;
  undefined4 local_40;
  undefined4 uStack_3c;
  undefined4 uStack_38;
  undefined4 uStack_34;
  
  TestCaseTracking::TrackerBase::close(&this->super_TrackerBase,__fd);
  pGVar9 = (GeneratorUntypedBase *)
           (this->super_TrackerBase).super_ITracker.m_children.
           super__Vector_base<Catch::Detail::unique_ptr<Catch::TestCaseTracking::ITracker>,_std::allocator<Catch::Detail::unique_ptr<Catch::TestCaseTracking::ITracker>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  _Var7._M_current =
       (StringRef *)
       (this->super_TrackerBase).super_ITracker.m_children.
       super__Vector_base<Catch::Detail::unique_ptr<Catch::TestCaseTracking::ITracker>,_std::allocator<Catch::Detail::unique_ptr<Catch::TestCaseTracking::ITracker>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (pGVar9 != (GeneratorUntypedBase *)_Var7._M_current) {
    lVar10 = (long)_Var7._M_current - (long)pGVar9 >> 5;
    pGVar8 = pGVar9;
    if (0 < lVar10) {
      pGVar8 = (GeneratorUntypedBase *)
               ((long)&pGVar9->_vptr_GeneratorUntypedBase +
               ((long)_Var7._M_current - (long)pGVar9 & 0xffffffffffffffe0U));
      lVar10 = lVar10 + 1;
      pGVar9 = (GeneratorUntypedBase *)&(pGVar9->m_stringReprCache)._M_string_length;
      do {
        lVar1 = *(long *)((long)&pGVar9[-1].m_stringReprCache.field_2 + 8);
        if (lVar1 == 0) goto LAB_0016fc99;
        if (*(int *)(lVar1 + 0x58) != 0) {
          pGVar9 = (GeneratorUntypedBase *)((long)&pGVar9[-1].m_stringReprCache.field_2 + 8);
          goto LAB_0016fb79;
        }
        if (pGVar9[-1].m_currentElementIndex == 0) goto LAB_0016fc99;
        if (*(int *)(pGVar9[-1].m_currentElementIndex + 0x58) != 0) {
          pGVar9 = (GeneratorUntypedBase *)&pGVar9[-1].m_currentElementIndex;
          goto LAB_0016fb79;
        }
        if (pGVar9->_vptr_GeneratorUntypedBase == (_func_int **)0x0) goto LAB_0016fc99;
        if (*(int *)(pGVar9->_vptr_GeneratorUntypedBase + 0xb) != 0) goto LAB_0016fb79;
        pcVar2 = (pGVar9->m_stringReprCache)._M_dataplus._M_p;
        if (pcVar2 == (pointer)0x0) goto LAB_0016fc99;
        if (*(int *)(pcVar2 + 0x58) != 0) {
          pGVar9 = (GeneratorUntypedBase *)&pGVar9->m_stringReprCache;
          goto LAB_0016fb79;
        }
        lVar10 = lVar10 + -1;
        pGVar9 = (GeneratorUntypedBase *)((pGVar9->m_stringReprCache).field_2._M_local_buf + 8);
      } while (1 < lVar10);
    }
    lVar10 = (long)_Var7._M_current - (long)pGVar8 >> 3;
    if (lVar10 == 1) {
LAB_0016fb50:
      if (pGVar8->_vptr_GeneratorUntypedBase == (_func_int **)0x0) {
LAB_0016fc99:
        __assert_fail("m_ptr",
                      "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/test/catch_amalgamated.hpp"
                      ,0x389,
                      "const T *Catch::Detail::unique_ptr<Catch::TestCaseTracking::ITracker>::operator->() const [T = Catch::TestCaseTracking::ITracker]"
                     );
      }
      pGVar9 = pGVar8;
      if (*(int *)(pGVar8->_vptr_GeneratorUntypedBase + 0xb) == 0) {
        pGVar9 = (GeneratorUntypedBase *)_Var7._M_current;
      }
    }
    else if (lVar10 == 2) {
LAB_0016fb3a:
      if (pGVar8->_vptr_GeneratorUntypedBase == (_func_int **)0x0) goto LAB_0016fc99;
      pGVar9 = pGVar8;
      if (*(int *)(pGVar8->_vptr_GeneratorUntypedBase + 0xb) == 0) {
        pGVar8 = (GeneratorUntypedBase *)&pGVar8->m_stringReprCache;
        goto LAB_0016fb50;
      }
    }
    else {
      pGVar9 = (GeneratorUntypedBase *)_Var7._M_current;
      if (lVar10 == 3) {
        if (pGVar8->_vptr_GeneratorUntypedBase == (_func_int **)0x0) goto LAB_0016fc99;
        pGVar9 = pGVar8;
        if (*(int *)(pGVar8->_vptr_GeneratorUntypedBase + 0xb) == 0) {
          pGVar8 = (GeneratorUntypedBase *)&pGVar8->m_stringReprCache;
          goto LAB_0016fb3a;
        }
      }
    }
LAB_0016fb79:
    pGVar13 = this;
    if (pGVar9 == (GeneratorUntypedBase *)_Var7._M_current) {
      do {
        pGVar13 = (GeneratorTracker *)(pGVar13->super_TrackerBase).super_ITracker.m_parent;
        iVar6 = (*(pGVar13->super_TrackerBase).super_ITracker._vptr_ITracker[5])(pGVar13);
      } while ((char)iVar6 == '\0');
      _Var7._M_current = (StringRef *)(pGVar13->super_IGeneratorTracker)._vptr_IGeneratorTracker;
      if ((GeneratorUntypedBase *)_Var7._M_current == (pGVar13->m_generator).m_ptr) {
        bVar14 = true;
      }
      else {
        puVar12 = (this->super_TrackerBase).super_ITracker.m_children.
                  super__Vector_base<Catch::Detail::unique_ptr<Catch::TestCaseTracking::ITracker>,_std::allocator<Catch::Detail::unique_ptr<Catch::TestCaseTracking::ITracker>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        puVar3 = (this->super_TrackerBase).super_ITracker.m_children.
                 super__Vector_base<Catch::Detail::unique_ptr<Catch::TestCaseTracking::ITracker>,_std::allocator<Catch::Detail::unique_ptr<Catch::TestCaseTracking::ITracker>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        bVar14 = puVar12 != puVar3;
        if (bVar14) {
          bVar14 = true;
          do {
            if (puVar12->m_ptr == (ITracker *)0x0) goto LAB_0016fc99;
            uVar5 = (*puVar12->m_ptr->_vptr_ITracker[5])();
            _Var7._M_current = (StringRef *)(ulong)uVar5;
            if ((char)uVar5 != '\0') {
              pIVar4 = puVar12->m_ptr;
              if (pIVar4 == (ITracker *)0x0) {
                __assert_fail("m_ptr",
                              "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/test/catch_amalgamated.hpp"
                              ,0x381,
                              "const T &Catch::Detail::unique_ptr<Catch::TestCaseTracking::ITracker>::operator*() const [T = Catch::TestCaseTracking::ITracker]"
                             );
              }
              local_40 = *(undefined4 *)((long)&pIVar4[1].m_nameAndLocation.name.field_2 + 8);
              uStack_3c = *(undefined4 *)((long)&pIVar4[1].m_nameAndLocation.name.field_2 + 0xc);
              uStack_38 = *(undefined4 *)&pIVar4[1].m_nameAndLocation.location.file;
              uStack_34 = *(undefined4 *)((long)&pIVar4[1].m_nameAndLocation.location.file + 4);
              _Var7 = std::
                      __find_if<__gnu_cxx::__normal_iterator<Catch::StringRef_const*,std::vector<Catch::StringRef,std::allocator<Catch::StringRef>>>,__gnu_cxx::__ops::_Iter_equals_val<Catch::StringRef_const>>
                                ((pGVar13->super_IGeneratorTracker)._vptr_IGeneratorTracker,
                                 (pGVar13->m_generator).m_ptr,&local_40);
              if ((GeneratorUntypedBase *)_Var7._M_current != (pGVar13->m_generator).m_ptr) break;
            }
            puVar12 = puVar12 + 1;
            bVar14 = puVar12 != puVar3;
          } while (bVar14);
        }
      }
      goto LAB_0016fb84;
    }
  }
  bVar14 = false;
LAB_0016fb84:
  pGVar9 = (this->m_generator).m_ptr;
  if (pGVar9 == (GeneratorUntypedBase *)0x0) {
    __assert_fail("m_generator && \"Tracker without generator\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/test/catch_amalgamated.cpp"
                  ,0x1459,
                  "virtual void Catch::Generators::(anonymous namespace)::GeneratorTracker::close()"
                 );
  }
  if (!bVar14) {
    if ((this->super_TrackerBase).super_ITracker.m_runState != CompletedSuccessfully) {
      return (int)_Var7._M_current;
    }
    iVar6 = (**pGVar9->_vptr_GeneratorUntypedBase)(pGVar9);
    if ((char)iVar6 == '\0') {
      return iVar6;
    }
    (pGVar9->m_stringReprCache)._M_string_length = 0;
    _Var7._M_current = (StringRef *)(pGVar9->m_stringReprCache)._M_dataplus._M_p;
    *(undefined1 *)&((GeneratorUntypedBase *)_Var7._M_current)->_vptr_GeneratorUntypedBase = 0;
    pGVar9->m_currentElementIndex = pGVar9->m_currentElementIndex + 1;
  }
  iVar6 = (int)_Var7._M_current;
  puVar12 = (this->super_TrackerBase).super_ITracker.m_children.
            super__Vector_base<Catch::Detail::unique_ptr<Catch::TestCaseTracking::ITracker>,_std::allocator<Catch::Detail::unique_ptr<Catch::TestCaseTracking::ITracker>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar3 = (this->super_TrackerBase).super_ITracker.m_children.
           super__Vector_base<Catch::Detail::unique_ptr<Catch::TestCaseTracking::ITracker>,_std::allocator<Catch::Detail::unique_ptr<Catch::TestCaseTracking::ITracker>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  puVar11 = puVar12;
  if (puVar3 != puVar12) {
    do {
      if (puVar11->m_ptr != (ITracker *)0x0) {
        uVar5 = (*puVar11->m_ptr->_vptr_ITracker[1])();
        _Var7._M_current = (StringRef *)(ulong)uVar5;
      }
      iVar6 = (int)_Var7._M_current;
      puVar11 = puVar11 + 1;
    } while (puVar11 != puVar3);
    (this->super_TrackerBase).super_ITracker.m_children.
    super__Vector_base<Catch::Detail::unique_ptr<Catch::TestCaseTracking::ITracker>,_std::allocator<Catch::Detail::unique_ptr<Catch::TestCaseTracking::ITracker>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = puVar12;
  }
  (this->super_TrackerBase).super_ITracker.m_runState = Executing;
  return iVar6;
}

Assistant:

void close() override {
                    TrackerBase::close();
                    // If a generator has a child (it is followed by a section)
                    // and none of its children have started, then we must wait
                    // until later to start consuming its values.
                    // This catches cases where `GENERATE` is placed between two
                    // `SECTION`s.
                    // **The check for m_children.empty cannot be removed**.
                    // doing so would break `GENERATE` _not_ followed by
                    // `SECTION`s.
                    const bool should_wait_for_child = [&]() {
                        // No children -> nobody to wait for
                        if ( m_children.empty() ) { return false; }
                        // If at least one child started executing, don't wait
                        if ( std::find_if(
                                 m_children.begin(),
                                 m_children.end(),
                                 []( TestCaseTracking::ITrackerPtr const&
                                         tracker ) {
                                     return tracker->hasStarted();
                                 } ) != m_children.end() ) {
                            return false;
                        }

                        // No children have started. We need to check if they
                        // _can_ start, and thus we should wait for them, or
                        // they cannot start (due to filters), and we shouldn't
                        // wait for them
                        ITracker* parent = m_parent;
                        // This is safe: there is always at least one section
                        // tracker in a test case tracking tree
                        while ( !parent->isSectionTracker() ) {
                            parent = parent->parent();
                        }
                        assert( parent &&
                                "Missing root (test case) level section" );

                        auto const& parentSection =
                            static_cast<SectionTracker const&>( *parent );
                        auto const& filters = parentSection.getFilters();
                        // No filters -> no restrictions on running sections
                        if ( filters.empty() ) { return true; }

                        for ( auto const& child : m_children ) {
                            if ( child->isSectionTracker() &&
                                 std::find( filters.begin(),
                                            filters.end(),
                                            static_cast<SectionTracker const&>(
                                                *child )
                                                .trimmedName() ) !=
                                     filters.end() ) {
                                return true;
                            }
                        }
                        return false;
                    }();

                    // This check is a bit tricky, because m_generator->next()
                    // has a side-effect, where it consumes generator's current
                    // value, but we do not want to invoke the side-effect if
                    // this generator is still waiting for any child to start.
                    assert( m_generator && "Tracker without generator" );
                    if ( should_wait_for_child ||
                         ( m_runState == CompletedSuccessfully &&
                           m_generator->countedNext() ) ) {
                        m_children.clear();
                        m_runState = Executing;
                    }
                }